

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O3

void __thiscall libtorrent::aux::session_impl::start_session(session_impl *this)

{
  peer_class_pool *this_00;
  array<unsigned_int,_6UL> *paVar1;
  uint *puVar2;
  mutex *pmVar3;
  SSL_CTX *ctx;
  int iVar4;
  peer_class_t pVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  undefined4 extraout_var;
  peer_class *ppVar9;
  long *plVar10;
  uint uVar11;
  char *pcVar12;
  undefined8 uVar13;
  uint uVar14;
  undefined1 local_d8 [8];
  executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_session_impl_cpp:676:22),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
  *local_d0;
  executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_session_impl_cpp:676:22),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
  *apeStack_c8 [2];
  ulong local_b8;
  error_code local_b0;
  string local_a0;
  string local_80;
  string local_60;
  io_context *local_40;
  allocator<void> local_38 [4];
  uint local_34;
  
  pcVar12 = "start session";
  session_log(this,"start session");
  ERR_clear_error();
  iVar4 = SSL_CTX_set_default_verify_paths((SSL_CTX *)(this->m_ssl_ctx).handle_);
  if (iVar4 != 1) {
    uVar8 = ERR_get_error();
    local_b0.val_ = (int)uVar8;
    if ((DAT_004ecf68 == -0x4d54ee85da8120f3) || (DAT_004ecf68 == -0x70502de1da3a1f65)) {
      local_b0.failed_ = local_b0.val_ != 0;
    }
    else {
      pcVar12 = (char *)(uVar8 & 0xffffffff);
      local_b0.failed_ =
           (bool)(**(code **)(boost::asio::error::get_ssl_category()::instance + 0x30))
                           (&boost::asio::error::get_ssl_category()::instance);
    }
    local_b0.cat_ = (error_category *)&boost::asio::error::get_ssl_category()::instance;
    if (local_b0.failed_ != false) {
      (**(code **)(boost::asio::error::get_ssl_category()::instance + 0x20))
                (local_d8,&boost::asio::error::get_ssl_category()::instance,uVar8 & 0xffffffff);
      pcVar12 = "SSL set_default verify_paths failed: %s";
      session_log(this,"SSL set_default verify_paths failed: %s",local_d8);
      if (local_d8 != (undefined1  [8])apeStack_c8) {
        pcVar12 = (char *)((long)&(apeStack_c8[0]->super_scheduler_operation).next_ + 1);
        operator_delete((void *)local_d8,(ulong)pcVar12);
      }
    }
  }
  ctx = (SSL_CTX *)(this->m_peer_ssl_ctx).handle_;
  iVar4 = SSL_CTX_get_verify_callback((int)ctx,(X509_STORE_CTX *)pcVar12);
  SSL_CTX_set_verify(ctx,0,(callback *)CONCAT44(extraout_var,iVar4));
  local_b0.val_ = 0;
  local_b0.failed_ = false;
  local_b0.cat_ =
       &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  aux::ssl::set_server_name_callback
            ((this->m_peer_ssl_ctx).handle_,anon_unknown_119::ssl_server_name_callback,this,
             &local_b0);
  this->m_next_lsd_torrent = 0;
  this->m_next_dht_torrent = 0;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"global","");
  this_00 = &this->m_classes;
  pVar5 = peer_class_pool::new_peer_class(this_00,&local_60);
  (this->m_global_class).m_val = pVar5.m_val;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"tcp","");
  pVar5 = peer_class_pool::new_peer_class(this_00,&local_80);
  (this->m_tcp_peer_class).m_val = pVar5.m_val;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"local","");
  pVar5 = peer_class_pool::new_peer_class(this_00,&local_a0);
  (this->m_local_peer_class).m_val = pVar5.m_val;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    pVar5.m_val = (this->m_local_peer_class).m_val;
  }
  ppVar9 = peer_class_pool::at(this_00,pVar5);
  ppVar9->ignore_unchoke_slots = true;
  ppVar9 = peer_class_pool::at(this_00,(peer_class_t)(this->m_local_peer_class).m_val);
  ppVar9->connection_limit_factor = 0x96;
  init_peer_class_filter(this,true);
  uVar11 = (this->m_tcp_peer_class).m_val;
  if (uVar11 < 0x20) {
    uVar11 = 1 << ((byte)uVar11 & 0x1f);
    paVar1 = &(this->m_peer_class_type_filter).m_peer_class_type;
    paVar1->_M_elems[0] = paVar1->_M_elems[0] | uVar11;
    puVar2 = (this->m_peer_class_type_filter).m_peer_class_type._M_elems + 2;
    *puVar2 = *puVar2 | uVar11;
    puVar2 = (this->m_peer_class_type_filter).m_peer_class_type._M_elems + 4;
    *puVar2 = *puVar2 | uVar11;
  }
  session_log(this,"version: %s revision: %lx","2.1.0.0",0x283cea598);
  uVar6 = max_open_files();
  pmVar3 = &(this->m_settings).m_mutex;
  local_d0 = (executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_session_impl_cpp:676:22),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
              *)((ulong)local_d0 & 0xffffffffffffff00);
  local_d8 = (undefined1  [8])pmVar3;
  ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_d8);
  local_d0._0_1_ = true;
  uVar11 = (this->m_settings).m_store.m_ints._M_elems[0x55];
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_d8);
  uVar7 = uVar6 * 8 - 0xa0;
  uVar14 = 5;
  if (0x3b < (int)uVar7) {
    uVar14 = uVar7 / 10;
  }
  if ((int)uVar11 <= (int)uVar14) {
    uVar14 = uVar11;
  }
  local_d0._0_1_ = false;
  local_d8 = (undefined1  [8])pmVar3;
  local_b8 = (ulong)uVar6;
  ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_d8);
  local_d0._0_1_ = true;
  (this->m_settings).m_store.m_ints._M_elems[0x55] = uVar14;
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_d8);
  if (((this->m_alerts).m_alert_mask._M_i.m_val >> 0xd & 1) != 0) {
    local_d0._0_1_ = false;
    local_d8 = (undefined1  [8])pmVar3;
    ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_d8);
    local_d0._0_1_ = true;
    uVar11 = (this->m_settings).m_store.m_ints._M_elems[0x55];
    ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_d8);
    session_log(this,"max-connections: %d max-files: %d",(ulong)uVar11,local_b8);
  }
  local_40 = this->m_io_context;
  local_34 = 1;
  plVar10 = (long *)__tls_get_addr(&PTR_004eaf08);
  if (*plVar10 == 0) {
    uVar13 = 0;
  }
  else {
    uVar13 = *(undefined8 *)(*plVar10 + 8);
  }
  local_d8 = (undefined1  [8])local_38;
  local_d0 = (executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_session_impl_cpp:676:22),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
              *)boost::asio::detail::thread_info_base::
                allocate<boost::asio::detail::thread_info_base::default_tag>(uVar13,0x28);
  (local_d0->super_scheduler_operation).next_ = (scheduler_operation *)0x0;
  (local_d0->super_scheduler_operation).func_ =
       boost::asio::detail::
       executor_op<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/session_impl.cpp:676:22),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
       ::do_complete;
  (local_d0->super_scheduler_operation).task_result_ = 0;
  (local_d0->handler_).this = this;
  apeStack_c8[0] = local_d0;
  boost::asio::detail::scheduler::post_immediate_completion
            (local_40->impl_,(operation *)local_d0,SUB41((local_34 & 2) >> 1,0));
  local_d0 = (executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_session_impl_cpp:676:22),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
              *)0x0;
  apeStack_c8[0] =
       (executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_session_impl_cpp:676:22),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
        *)0x0;
  boost::asio::detail::
  executor_op<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/session_impl.cpp:676:22),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
  ::ptr::reset((ptr *)local_d8);
  return;
}

Assistant:

void session_impl::start_session()
	{
#ifndef TORRENT_DISABLE_LOGGING
		session_log("start session");
#endif

#if TORRENT_USE_SSL
		error_code ec;
		m_ssl_ctx.set_default_verify_paths(ec);
#ifndef TORRENT_DISABLE_LOGGING
		if (ec) session_log("SSL set_default verify_paths failed: %s", ec.message().c_str());
		ec.clear();
#endif
#if defined TORRENT_WINDOWS && defined TORRENT_USE_OPENSSL && !defined TORRENT_WINRT
		// TODO: come up with some abstraction to do this for gnutls as well
		// load certificates from the windows system certificate store
		X509_STORE* store = X509_STORE_new();
		if (store)
		{
			HCERTSTORE system_store = CertOpenSystemStoreA(0, "ROOT");
			// this is best effort
			if (system_store)
			{
				CERT_CONTEXT const* ctx = nullptr;
				while ((ctx = CertEnumCertificatesInStore(system_store, ctx)) != nullptr)
				{
					unsigned char const* cert_ptr = reinterpret_cast<unsigned char const*>(ctx->pbCertEncoded);
					X509* x509 = d2i_X509(nullptr, &cert_ptr, ctx->cbCertEncoded);
					// this is best effort
					if (!x509) continue;
					X509_STORE_add_cert(store, x509);
					X509_free(x509);
				}
				CertFreeCertificateContext(ctx);
				CertCloseStore(system_store, 0);
			}
		}

		SSL_CTX* ssl_ctx = m_ssl_ctx.native_handle();
		SSL_CTX_set_cert_store(ssl_ctx, store);
#endif
#ifdef __APPLE__
		m_ssl_ctx.load_verify_file("/etc/ssl/cert.pem", ec);
#ifndef TORRENT_DISABLE_LOGGING
		if (ec) session_log("SSL load_verify_file failed: %s", ec.message().c_str());
		ec.clear();
#endif
		m_ssl_ctx.add_verify_path("/etc/ssl/certs", ec);
#ifndef TORRENT_DISABLE_LOGGING
		if (ec) session_log("SSL add_verify_path failed: %s", ec.message().c_str());
		ec.clear();
#endif
#endif // __APPLE__
#endif // TORRENT_USE_SSL
#ifdef TORRENT_SSL_PEERS
		m_peer_ssl_ctx.set_verify_mode(ssl::context::verify_none, ec);
		ssl::set_server_name_callback(ssl::get_handle(m_peer_ssl_ctx), ssl_server_name_callback, this, ec);
#endif // TORRENT_SSL_PEERS

#ifndef TORRENT_DISABLE_DHT
		m_next_dht_torrent = 0;
#endif
		m_next_lsd_torrent = 0;

		m_global_class = m_classes.new_peer_class("global");
		m_tcp_peer_class = m_classes.new_peer_class("tcp");
		m_local_peer_class = m_classes.new_peer_class("local");
		// local peers are always unchoked
		m_classes.at(m_local_peer_class)->ignore_unchoke_slots = true;
		// local peers are allowed to exceed the normal connection
		// limit by 50%
		m_classes.at(m_local_peer_class)->connection_limit_factor = 150;

		TORRENT_ASSERT(m_global_class == session::global_peer_class_id);
		TORRENT_ASSERT(m_tcp_peer_class == session::tcp_peer_class_id);
		TORRENT_ASSERT(m_local_peer_class == session::local_peer_class_id);

		init_peer_class_filter(true);

		// TCP, SSL/TCP and I2P connections should be assigned the TCP peer class
		m_peer_class_type_filter.add(peer_class_type_filter::tcp_socket, m_tcp_peer_class);
		m_peer_class_type_filter.add(peer_class_type_filter::ssl_tcp_socket, m_tcp_peer_class);
		m_peer_class_type_filter.add(peer_class_type_filter::i2p_socket, m_tcp_peer_class);

#ifndef TORRENT_DISABLE_LOGGING

		session_log("version: %s revision: %" PRIx64
			, lt::version_str, lt::version_revision);

#endif // TORRENT_DISABLE_LOGGING

		// ---- auto-cap max connections ----
		int const max_files = max_open_files();
		// deduct some margin for epoll/kqueue, log files,
		// futexes, shared objects etc.
		// 80% of the available file descriptors should go to connections
		m_settings.set_int(settings_pack::connections_limit, std::min(
			m_settings.get_int(settings_pack::connections_limit)
			, std::max(5, (max_files - 20) * 8 / 10)));
		// 20% goes towards regular files (see disk_io_thread)
#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			session_log("max-connections: %d max-files: %d"
				, m_settings.get_int(settings_pack::connections_limit)
				, max_files);
		}
#endif

		post(m_io_context, [this] { wrap(&session_impl::init); });
	}